

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O1

Bbl_Man_t * Bbl_ManStart(char *pName)

{
  Bbl_Man_t *__s;
  size_t sVar1;
  Vec_Str_t *pVVar2;
  char *pcVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  
  __s = (Bbl_Man_t *)malloc(0x4d0);
  memset(__s,0,0x4d0);
  if (pName == (char *)0x0) {
    pVVar2 = (Vec_Str_t *)malloc(0x10);
    pVVar2->nCap = 0;
    pVVar2->nSize = 0;
    pVVar2->pArray = (char *)0x0;
    __s->pName = pVVar2;
    pVVar2->nSize = 0;
  }
  else {
    sVar1 = strlen(pName);
    uVar7 = (int)sVar1 + 1;
    pVVar2 = (Vec_Str_t *)malloc(0x10);
    iVar6 = 0x10;
    if (0xe < (uVar7 | 3)) {
      iVar6 = (uVar7 & 0xfffffffc) + 4;
    }
    pVVar2->nSize = 0;
    pVVar2->nCap = iVar6;
    pcVar3 = (char *)malloc((long)iVar6);
    pVVar2->pArray = pcVar3;
    __s->pName = pVVar2;
    pVVar2->nSize = iVar6;
    strcpy(pcVar3,pName);
  }
  pVVar2 = (Vec_Str_t *)malloc(0x10);
  pVVar2->nCap = 0x10000;
  pVVar2->nSize = 0;
  pcVar3 = (char *)malloc(0x10000);
  pVVar2->pArray = pcVar3;
  __s->pObjs = pVVar2;
  pVVar2 = (Vec_Str_t *)malloc(0x10);
  pVVar2->nCap = 0x10000;
  pVVar2->nSize = 0;
  pcVar3 = (char *)malloc(0x10000);
  pVVar2->pArray = pcVar3;
  __s->pFncs = pVVar2;
  pVVar2 = (Vec_Str_t *)malloc(0x10);
  pVVar2->nCap = 0x10000;
  pVVar2->nSize = 0;
  pcVar3 = (char *)malloc(0x10000);
  pVVar2->pArray = pcVar3;
  __s->pEnts = pVVar2;
  pVVar2->nSize = 1;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x400;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x1000);
  pVVar4->pArray = piVar5;
  pVVar4->nSize = 0x400;
  memset(piVar5,0,0x1000);
  __s->vId2Obj = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x400;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x1000);
  pVVar4->pArray = piVar5;
  pVVar4->nSize = 0x400;
  memset(piVar5,0,0x1000);
  __s->vFaninNums = pVVar4;
  return __s;
}

Assistant:

Bbl_Man_t * Bbl_ManStart( char * pName )
{
    Bbl_Man_t * p;
    int nLength;
    p = BBLIF_ALLOC( Bbl_Man_t, 1 );
    memset( p, 0, sizeof(Bbl_Man_t) );
    nLength = pName? 4 * ((strlen(pName) + 1) / 4 + 1) : 0;
    p->pName  = Vec_StrAlloc( nLength );
    p->pName->nSize = p->pName->nCap;
    if ( pName )
        strcpy( p->pName->pArray, pName );
    p->pObjs = Vec_StrAlloc( 1 << 16 );
    p->pFncs = Vec_StrAlloc( 1 << 16 );
    p->pEnts = Vec_StrAlloc( 1 << 16 ); p->pEnts->nSize = 1;
    p->vId2Obj = Vec_IntStart( 1 << 10 );
    p->vFaninNums = Vec_IntStart( 1 << 10 );
    return p;
}